

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O3

TOK __thiscall Lexer::yylex0(Lexer *this)

{
  string *this_00;
  char *pcVar1;
  pointer pcVar2;
  size_type sVar3;
  byte *pbVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  uint uVar11;
  TOK TVar12;
  char cVar13;
  char cVar14;
  bool bVar15;
  long *local_48 [2];
  long local_38 [2];
  
  this_00 = &this->yytext;
  cVar13 = this->yychar;
  do {
    iVar6 = isspace((int)cVar13);
    uVar11 = this->yylineno;
    if (iVar6 != 0) {
      pcVar2 = (this->yycode)._M_dataplus._M_p;
      pcVar9 = (this->yypos)._M_current;
      sVar3 = (this->yycode)._M_string_length;
      do {
        if (pcVar9 == pcVar2 + sVar3) {
          this->yychar = '\0';
          cVar13 = '\0';
        }
        else {
          pcVar1 = pcVar9 + 1;
          (this->yypos)._M_current = pcVar1;
          cVar13 = *pcVar9;
          this->yychar = cVar13;
          pcVar9 = pcVar1;
          if (cVar13 == '\n') {
            uVar11 = uVar11 + 1;
            this->yylineno = uVar11;
            cVar13 = '\n';
          }
        }
        iVar6 = isspace((int)cVar13);
      } while (iVar6 != 0);
    }
    this->yytokenlineno = uVar11;
    (this->yytext)._M_string_length = 0;
    *(this->yytext)._M_dataplus._M_p = '\0';
    bVar5 = this->yychar;
    iVar6 = (int)(char)bVar5;
    if (bVar5 == 0) {
      return T_EOF_SYMBOL;
    }
    cVar13 = (char)this_00;
    std::__cxx11::string::push_back(cVar13);
    pcVar9 = (this->yycode)._M_dataplus._M_p;
    pcVar1 = (this->yypos)._M_current;
    pcVar8 = pcVar9 + (this->yycode)._M_string_length;
    if (pcVar1 == pcVar8) {
      this->yychar = '\0';
      cVar14 = '\0';
      pcVar10 = pcVar1;
joined_r0x0010c0b1:
      if (bVar5 == 0x25) {
        iVar6 = 0x25;
LAB_0010c432:
        iVar7 = isalpha((int)cVar14);
        if (iVar7 != 0) {
          while (((iVar6 = isalnum((int)cVar14), iVar6 != 0 || (cVar14 == '_')) || (cVar14 == '-')))
          {
            std::__cxx11::string::push_back(cVar13);
            pcVar9 = (this->yypos)._M_current;
            if (pcVar9 == (this->yycode)._M_dataplus._M_p + (this->yycode)._M_string_length) {
              this->yychar = '\0';
              cVar14 = '\0';
            }
            else {
              (this->yypos)._M_current = pcVar9 + 1;
              cVar14 = *pcVar9;
              this->yychar = cVar14;
              if (cVar14 == '\n') {
                this->yylineno = this->yylineno + 1;
                cVar14 = '\n';
              }
            }
          }
          iVar6 = std::__cxx11::string::compare((char *)this_00);
          if (iVar6 == 0) {
            return T_EXTERN;
          }
          iVar6 = std::__cxx11::string::compare((char *)this_00);
          if (iVar6 == 0) {
            return T_TOKEN_TYPE;
          }
          iVar6 = std::__cxx11::string::compare((char *)this_00);
          if (iVar6 == 0) {
            return T_TOKEN;
          }
          iVar6 = std::__cxx11::string::compare((char *)this_00);
          if (iVar6 == 0) {
            return T_CLASS;
          }
          iVar6 = std::__cxx11::string::compare((char *)this_00);
          if (iVar6 == 0) {
            return T_EXTENDS;
          }
          return T_ERROR;
        }
        bVar15 = false;
        goto LAB_0010c531;
      }
    }
    else {
      pcVar10 = pcVar1 + 1;
      (this->yypos)._M_current = pcVar10;
      cVar14 = *pcVar1;
      this->yychar = cVar14;
      if (cVar14 == '\n') {
        this->yylineno = this->yylineno + 1;
        cVar14 = '\n';
        goto joined_r0x0010c0b1;
      }
      if (cVar14 == '{' && bVar5 == 0x25) {
        if (pcVar10 == pcVar8) {
          this->yychar = '\0';
        }
        else {
          (this->yypos)._M_current = pcVar1 + 2;
          cVar13 = pcVar1[1];
          this->yychar = cVar13;
          if (cVar13 == '\n') {
            this->yylineno = this->yylineno + 1;
          }
        }
        skip(this,'{','{','}');
        std::__cxx11::string::string
                  ((string *)local_48,(string *)this_00,2,(this->yytext)._M_string_length - 4);
        std::__cxx11::string::operator=((string *)this_00,(string *)local_48);
        if (local_48[0] != local_38) {
          operator_delete(local_48[0],local_38[0] + 1);
        }
        return T_TEXT;
      }
      if (bVar5 == 0x25) goto LAB_0010c432;
    }
    if (bVar5 != 0x2f) {
      if (bVar5 < 0x3a) {
        switch(bVar5) {
        case 0x23:
          return T_POUND;
        case 0x27:
          std::__cxx11::string::_M_replace_aux
                    ((ulong)this_00,0,(this->yytext)._M_string_length,'\x01');
          bVar5 = this->yychar;
          TVar12 = T_ERROR;
          goto LAB_0010c29a;
        case 0x28:
          if (pcVar10[-2] != '(') {
            __assert_fail("*pos == \'(\'",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/pgen/lexer.cc"
                          ,99,"TOK Lexer::yylex0()");
          }
          if (pcVar10 + -2 != pcVar9) {
            cVar13 = pcVar10[-3];
            iVar6 = isalnum((int)cVar13);
            if ((cVar13 != 0x5f) && (iVar6 == 0)) {
              return T_LPAREN;
            }
            skip(this,'(','(',')');
            std::__cxx11::string::string
                      ((string *)local_48,(string *)this_00,1,(this->yytext)._M_string_length - 2);
            std::__cxx11::string::operator=((string *)this_00,(string *)local_48);
            if (local_48[0] != local_38) {
              operator_delete(local_48[0],local_38[0] + 1);
            }
            return T_EXTRA;
          }
          return T_LPAREN;
        case 0x29:
          return T_RPAREN;
        case 0x2a:
          return T_STAR;
        case 0x2b:
          return T_PLUS;
        case 0x2c:
          return T_COMMA;
        }
      }
      else if (bVar5 < 0x3f) {
        if (bVar5 == 0x3a) {
          return T_COLON;
        }
        if (bVar5 == 0x3b) {
          return T_SEMICOLON;
        }
      }
      else {
        if (bVar5 == 0x3f) {
          return T_QUESTION;
        }
        if (bVar5 == 0x7b) {
          skip(this,'{','{','}');
          return T_CODE;
        }
        if (bVar5 == 0x7c) {
          return T_BAR;
        }
      }
      bVar15 = bVar5 == 0x5f;
LAB_0010c531:
      iVar6 = isalpha(iVar6);
      if ((!bVar15) && (iVar6 == 0)) {
        return T_ERROR;
      }
      iVar7 = (int)cVar14;
      iVar6 = isalnum(iVar7);
      while (((char)iVar7 == '_' || (iVar6 != 0))) {
        std::__cxx11::string::push_back(cVar13);
        pcVar9 = (this->yypos)._M_current;
        if (pcVar9 == (this->yycode)._M_dataplus._M_p + (this->yycode)._M_string_length) {
          this->yychar = '\0';
          cVar14 = '\0';
        }
        else {
          (this->yypos)._M_current = pcVar9 + 1;
          cVar14 = *pcVar9;
          this->yychar = cVar14;
          if (cVar14 == '\n') {
            this->yylineno = this->yylineno + 1;
            cVar14 = '\n';
          }
        }
        iVar7 = (int)cVar14;
        iVar6 = isalnum(iVar7);
      }
      return T_IDENTIFIER;
    }
    if (cVar14 == '*') {
      if (pcVar10 == pcVar8) {
        this->yychar = '\0';
        cVar13 = '\0';
      }
      else {
        pcVar9 = pcVar10 + 1;
        (this->yypos)._M_current = pcVar9;
        cVar13 = *pcVar10;
        this->yychar = cVar13;
        pcVar10 = pcVar9;
        if (cVar13 == '\n') {
          this->yylineno = this->yylineno + 1;
          cVar13 = '\n';
        }
      }
      uVar11 = this->yylineno;
      do {
        if (cVar13 == '\0') goto LAB_0010c1e6;
        if (pcVar10 == pcVar8) {
          this->yychar = '\0';
          cVar14 = '\0';
          pcVar9 = pcVar10;
        }
        else {
          pcVar9 = pcVar10 + 1;
          (this->yypos)._M_current = pcVar9;
          cVar14 = *pcVar10;
          this->yychar = cVar14;
          if (cVar14 == '\n') {
            uVar11 = uVar11 + 1;
            this->yylineno = uVar11;
            cVar14 = '\n';
          }
        }
        bVar15 = cVar13 != '*';
        pcVar10 = pcVar9;
        cVar13 = cVar14;
      } while ((bVar15) || (cVar14 != '/'));
      if (pcVar9 == pcVar8) {
        this->yychar = '\0';
LAB_0010c1e6:
        cVar13 = '\0';
      }
      else {
        (this->yypos)._M_current = pcVar9 + 1;
        cVar13 = *pcVar9;
        this->yychar = cVar13;
        if (cVar13 == '\n') {
          this->yylineno = this->yylineno + 1;
          cVar13 = '\n';
        }
      }
    }
    else {
      if (cVar14 != '/') {
        return T_SLASH;
      }
      uVar11 = this->yylineno;
      cVar13 = '/';
      while ((cVar13 != '\0' && (cVar13 != '\n'))) {
        if (pcVar10 == pcVar8) {
          this->yychar = '\0';
          cVar13 = '\0';
        }
        else {
          pcVar9 = pcVar10 + 1;
          (this->yypos)._M_current = pcVar9;
          cVar13 = *pcVar10;
          this->yychar = cVar13;
          pcVar10 = pcVar9;
          if (cVar13 == '\n') {
            uVar11 = uVar11 + 1;
            this->yylineno = uVar11;
            cVar13 = '\n';
          }
        }
      }
    }
  } while( true );
LAB_0010c29a:
  if (bVar5 < 0x5c) {
    if (bVar5 == 0) {
      return T_ERROR;
    }
    if (bVar5 == 10) {
      return T_ERROR;
    }
    if (bVar5 == 0x27) {
      std::__cxx11::string::push_back(cVar13);
      pcVar9 = (this->yypos)._M_current;
      if (pcVar9 == (this->yycode)._M_dataplus._M_p + (this->yycode)._M_string_length) {
        this->yychar = '\0';
        return T_CHAR_LITERAL;
      }
      (this->yypos)._M_current = pcVar9 + 1;
      cVar13 = *pcVar9;
      this->yychar = cVar13;
      TVar12 = T_CHAR_LITERAL;
      if (cVar13 != '\n') {
        return T_CHAR_LITERAL;
      }
LAB_0010c632:
      this->yylineno = this->yylineno + 1;
      return TVar12;
    }
  }
  else if (bVar5 == 0x5c) {
    std::__cxx11::string::push_back(cVar13);
    pcVar9 = (this->yypos)._M_current;
    if (pcVar9 == (this->yycode)._M_dataplus._M_p + (this->yycode)._M_string_length) {
      this->yychar = '\0';
      return T_ERROR;
    }
    (this->yypos)._M_current = pcVar9 + 1;
    cVar14 = *pcVar9;
    this->yychar = cVar14;
    if (cVar14 == '\0') {
      return T_ERROR;
    }
    if (cVar14 == '\n') goto LAB_0010c632;
  }
  std::__cxx11::string::push_back(cVar13);
  pbVar4 = (byte *)(this->yypos)._M_current;
  if (pbVar4 == (byte *)((this->yycode)._M_dataplus._M_p + (this->yycode)._M_string_length)) {
    this->yychar = '\0';
    bVar5 = 0;
  }
  else {
    (this->yypos)._M_current = (char *)(pbVar4 + 1);
    bVar5 = *pbVar4;
    this->yychar = bVar5;
    if (bVar5 == 10) {
      this->yylineno = this->yylineno + 1;
      bVar5 = 10;
    }
  }
  goto LAB_0010c29a;
}

Assistant:

TOK Lexer::yylex0() {
again:
  while (isspace(yychar)) yyinp();
  yytokenlineno = yylineno;
  yytext.clear();
  if (!yychar) return T_EOF_SYMBOL;
  auto ch = yychar;
  yytext += ch;
  yyinp();
  if (ch == '%' && yychar == '{') {
    yyinp();
    skip('{', '{', '}');
    yytext = std::string(yytext, 2, yytext.length() - 4);
    return T_TEXT;
  }
  if (ch == '%' && isalpha(yychar)) {
    while (isalnum(yychar) || yychar == '_' || yychar == '-') {
      yytext += yychar;
      yyinp();
    }
    if (yytext == "%extern") return T_EXTERN;
    if (yytext == "%token-type") return T_TOKEN_TYPE;
    if (yytext == "%token") return T_TOKEN;
    if (yytext == "%class") return T_CLASS;
    if (yytext == "%extends") return T_EXTENDS;
    return T_ERROR;
  }
  if (ch == '/') {
    if (yychar == '/') {
      for (; yychar; yyinp()) {
        if (yychar == '\n') break;
      }
      goto again;
    }
    if (yychar == '*') {
      yyinp();
      while (yychar) {
        auto ch = yychar;
        yyinp();
        if (ch == '*' && yychar == '/') {
          yyinp();
          break;
        }
      }
      goto again;
    }
    return T_SLASH;
  }
  if (ch == '\'') {
    yytext = ch;
    while (yychar && yychar != '\'' && yychar != '\n') {
      if (yychar == '\\') {
        yytext += yychar;
        yyinp();
        if (!yychar || yychar == '\n') break;
      }
      yytext += yychar;
      yyinp();
    }
    if (yychar != '\'') return T_ERROR;
    yytext += yychar;
    yyinp();
    return T_CHAR_LITERAL;
  }
  if (ch == '{') {
    skip(ch, '{', '}');
    return T_CODE;
  }
  if (ch == '(') {
    auto pos = yypos - 2;
    assert(*pos == '(');
    if (pos != yycode.cbegin() && (isalnum(pos[-1]) || pos[-1] == '_')) {
      skip(ch, '(', ')');
      yytext = std::string(yytext, 1, yytext.length() - 2);
      return T_EXTRA;
    }
    return T_LPAREN;
  }
  if (ch == '#') return T_POUND;
  if (ch == ')') return T_RPAREN;
  if (ch == '*') return T_STAR;
  if (ch == '+') return T_PLUS;
  if (ch == ',') return T_COMMA;
  if (ch == ':') return T_COLON;
  if (ch == ';') return T_SEMICOLON;
  if (ch == '?') return T_QUESTION;
  if (ch == '|') return T_BAR;
  if (isalpha(ch) || ch == '_') {
    while (isalnum(yychar) || yychar == '_') {
      yytext += yychar;
      yyinp();
    }
    return T_IDENTIFIER;
  }
  return T_ERROR;
}